

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFrhs(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  Status SVar2;
  pointer pnVar3;
  undefined8 uVar4;
  type_conflict5 tVar5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar6;
  ostream *poVar7;
  SPxInternalCodeException *this_00;
  int i;
  long lVar8;
  long lVar9;
  allocator local_99;
  cpp_dec_float<50U,_int,_void> local_98;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_58;
  string local_50;
  
  if (this->theRep == COLUMN) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(this->theFrhs);
    if (this->theType != LEAVE) {
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7b])(this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      return;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x7a])(this);
    local_58 = &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left;
    lVar8 = 0;
    for (lVar9 = 0;
        lVar9 < (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; lVar9 = lVar9 + 1) {
      local_98.fpclass = cpp_dec_float_finite;
      local_98.prec_elem = 10;
      local_98.data._M_elems[0] = 0;
      local_98.data._M_elems[1] = 0;
      local_98.data._M_elems[2] = 0;
      local_98.data._M_elems[3] = 0;
      local_98.data._M_elems[4] = 0;
      local_98.data._M_elems[5] = 0;
      local_98.data._M_elems._24_5_ = 0;
      local_98.data._M_elems[7]._1_3_ = 0;
      local_98.data._M_elems._32_5_ = 0;
      local_98.data._M_elems[9]._1_3_ = 0;
      local_98.exp = 0;
      local_98.neg = false;
      SVar2 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data[lVar9];
      if (this->theRep * SVar2 < 1) {
        pVVar6 = &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right;
        switch(SVar2) {
        default:
          poVar7 = std::operator<<((ostream *)&std::cerr,"ESVECS01 ERROR: ");
          poVar7 = std::operator<<(poVar7,"inconsistent basis must not happen!");
          std::endl<char,std::char_traits<char>>(poVar7);
          this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_50,"XSVECS01 This should never happen.",&local_99);
          SPxInternalCodeException::SPxInternalCodeException(this_00,&local_50);
          __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        case P_ON_LOWER:
          pVVar6 = local_58;
        case P_FIXED:
        case P_ON_UPPER:
          pnVar3 = (pVVar6->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar8 + 0x20);
          local_98.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_98.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar8);
          local_98.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_98.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar8 + 0x10);
          local_98.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar4 = *(undefined8 *)(puVar1 + 2);
          local_98.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_98.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_98.exp = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar8);
          local_98.neg = *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar8 + 4U);
          local_98._48_8_ = *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar8 + 8U);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    ((cpp_dec_float<50U,_int,_void> *)
                     ((long)(((this->theFrhs->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar8),&local_98);
          break;
        case P_FREE:
          break;
        }
      }
      lVar8 = lVar8 + 0x38;
    }
  }
  else {
    if (this->theType == ENTER) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(this->theFrhs);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7b])(this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator+=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)this->theFrhs,
                   &(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .object);
      return;
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(this->theFrhs,
                &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object);
    lVar8 = 0xc;
    for (lVar9 = 0;
        lVar9 < (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; lVar9 = lVar9 + 1) {
      SVar2 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data[lVar9];
      if (this->theRep * SVar2 < 1) {
        local_98.fpclass = cpp_dec_float_finite;
        local_98.prec_elem = 10;
        local_98.data._M_elems[0] = 0;
        local_98.data._M_elems[1] = 0;
        local_98.data._M_elems[2] = 0;
        local_98.data._M_elems[3] = 0;
        local_98.data._M_elems[4] = 0;
        local_98.data._M_elems[5] = 0;
        local_98.data._M_elems._24_5_ = 0;
        local_98.data._M_elems[7]._1_3_ = 0;
        local_98.data._M_elems._32_5_ = 0;
        local_98.data._M_elems[9]._1_3_ = 0;
        local_98.exp = 0;
        local_98.neg = false;
        switch(SVar2) {
        case D_FREE:
          goto switchD_0023fc8f_caseD_1;
        case D_ON_UPPER:
        case D_ON_LOWER:
        case D_ON_BOTH:
          pnVar3 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .object.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar4 = *(undefined8 *)((pnVar3->m_backend).data._M_elems + lVar8 + -4);
          local_98.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_98.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          puVar1 = (pnVar3->m_backend).data._M_elems + lVar8 + -0xc;
          local_98.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_98.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (pnVar3->m_backend).data._M_elems + lVar8 + -8;
          local_98.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar4 = *(undefined8 *)(puVar1 + 2);
          local_98.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_98.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_98.exp = (pnVar3->m_backend).data._M_elems[lVar8 + -2];
          local_98.neg = SUB41((pnVar3->m_backend).data._M_elems[lVar8 + -1],0);
          puVar1 = (pnVar3->m_backend).data._M_elems + lVar8;
          local_98.fpclass = puVar1[0];
          local_98.prec_elem = puVar1[1];
          break;
        default:
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_98,0.0);
        }
        local_50._M_dataplus._M_p = (pointer)0x0;
        tVar5 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_98,(double *)&local_50);
        if (tVar5) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::
          multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)this->theFrhs,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_98,
                     (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((this->thevectors->set).theitem + (this->thevectors->set).thekey[lVar9].idx
                        ));
        }
      }
switchD_0023fc8f_caseD_1:
      lVar8 = lVar8 + 0xe;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFrhs()
{

   if(rep() == COLUMN)
   {
      theFrhs->clear();

      if(type() == LEAVE)
      {
         computeFrhsXtra();

         for(int i = 0; i < this->nRows(); i++)
         {
            R x;

            typename SPxBasisBase<R>::Desc::Status stat = this->desc().rowStatus(i);

            if(!isBasic(stat))
            {
               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               // columnwise cases:
               case SPxBasisBase<R>::Desc::P_FREE :
                  continue;

               case(SPxBasisBase<R>::Desc::P_FIXED) :
                  assert(EQ(this->lhs(i), this->rhs(i), this->epsilon()));

               //lint -fallthrough
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  x = this->rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  x = this->lhs(i);
                  break;

               default:
                  SPX_MSG_ERROR(std::cerr << "ESVECS01 ERROR: "
                                << "inconsistent basis must not happen!"
                                << std::endl;)
                  throw SPxInternalCodeException("XSVECS01 This should never happen.");
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               (*theFrhs)[i] += x;     // slack !
            }
         }
      }
      else
      {
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
      }
   }
   else
   {
      assert(rep() == ROW);

      if(type() == ENTER)
      {
         theFrhs->clear();
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
         *theFrhs += this->maxObj();
      }
      else
      {
         ///@todo put this into a separate method
         *theFrhs = this->maxObj();
         const typename SPxBasisBase<R>::Desc& ds = this->desc();

         for(int i = 0; i < this->nRows(); ++i)
         {
            typename SPxBasisBase<R>::Desc::Status stat = ds.rowStatus(i);

            if(!isBasic(stat))
            {
               R x;

               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               case SPxBasisBase<R>::Desc::D_FREE :
                  continue;

               case SPxBasisBase<R>::Desc::D_ON_UPPER :
               case SPxBasisBase<R>::Desc::D_ON_LOWER :
               case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
                  x = this->maxRowObj(i);
                  break;

               default:
                  assert(this->lhs(i) <= R(-infinity) && this->rhs(i) >= R(infinity));
                  x = 0.0;
                  break;
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               // assert(x == 0.0);

               if(x != 0.0)
                  theFrhs->multAdd(x, vector(i));
            }
         }
      }
   }
}